

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_packet.cpp
# Opt level: O3

MppMeta mpp_packet_get_meta(MppPacket packet)

{
  MPP_RET MVar1;
  MppMeta pvVar2;
  
  MVar1 = check_is_mpp_packet_f(packet,"mpp_packet_get_meta");
  if (MVar1 == MPP_OK) {
    pvVar2 = *(MppMeta *)((long)packet + 0x48);
    if (pvVar2 == (MppMeta)0x0) {
      mpp_meta_get_with_tag((MppMeta *)((long)packet + 0x48),"mpp_packet","mpp_packet_get_meta");
      pvVar2 = *(MppMeta *)((long)packet + 0x48);
    }
  }
  else {
    pvVar2 = (MppMeta)0x0;
  }
  return pvVar2;
}

Assistant:

MppMeta mpp_packet_get_meta(const MppPacket packet)
{
    if (check_is_mpp_packet(packet))
        return NULL;

    MppPacketImpl *p = (MppPacketImpl *)packet;
    if (NULL == p->meta)
        mpp_meta_get(&p->meta);

    return p->meta;
}